

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O3

void Fxu_UpdateDouble(Fxu_Matrix *p)

{
  Fxu_Pair *pFVar1;
  int iVar2;
  Fxu_Double *pLink;
  Fxu_Var *pVar;
  Fxu_Var *pVar_00;
  Fxu_Cube *pFVar3;
  Fxu_Cube *pCube;
  Fxu_ListLit *pFVar4;
  Fxu_Lit *pFVar5;
  int iVar6;
  int iVar7;
  Fxu_ListLit *pFVar8;
  Fxu_Lit *pFVar9;
  
  pLink = Fxu_HeapDoubleGetMax(p->pHeapDouble);
  Fxu_ListTableDelDivisor(p,pLink);
  pVar = Fxu_MatrixAddVar(p);
  pVar->nCubes = 0;
  pVar_00 = Fxu_MatrixAddVar(p);
  pVar_00->nCubes = 2;
  iVar2 = 0;
  pFVar3 = Fxu_MatrixAddCube(p,pVar_00,0);
  pFVar3->pFirst = pFVar3;
  pCube = Fxu_MatrixAddCube(p,pVar_00,1);
  pCube->pFirst = pFVar3;
  pVar_00->pFirst = pFVar3;
  pFVar1 = (pLink->lPairs).pHead;
  pFVar8 = &pFVar1->pCube1->lLits;
  pFVar4 = &pFVar1->pCube2->lLits;
  iVar7 = 0;
  iVar6 = 0;
LAB_00445231:
  pFVar9 = pFVar8->pHead;
  do {
    pFVar5 = pFVar4->pHead;
    while( true ) {
      while ((pFVar9 != (Fxu_Lit *)0x0 && (pFVar5 != (Fxu_Lit *)0x0))) {
        if (pFVar9->iVar == pFVar5->iVar) {
          pFVar8 = (Fxu_ListLit *)&pFVar9->pHNext;
          pFVar4 = (Fxu_ListLit *)&pFVar5->pHNext;
          iVar2 = iVar2 + 1;
          goto LAB_00445231;
        }
        if (pFVar5->iVar <= pFVar9->iVar) {
          Fxu_MatrixAddLiteral(p,pCube,pFVar5->pVar);
          goto LAB_00445299;
        }
        Fxu_MatrixAddLiteral(p,pFVar3,pFVar9->pVar);
        pFVar9 = pFVar9->pHNext;
        iVar7 = iVar7 + 1;
      }
      if ((pFVar9 == (Fxu_Lit *)0x0) || (pFVar5 != (Fxu_Lit *)0x0)) break;
      Fxu_MatrixAddLiteral(p,pFVar3,pFVar9->pVar);
      pFVar9 = pFVar9->pHNext;
      iVar7 = iVar7 + 1;
      pFVar5 = (Fxu_Lit *)0x0;
    }
    if ((pFVar9 != (Fxu_Lit *)0x0) || (pFVar5 == (Fxu_Lit *)0x0)) {
      if (pFVar1->nLits1 != iVar7) {
        __assert_fail("pPair->nLits1 == nLits1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                      ,0x183,
                      "void Fxu_UpdateMatrixDoubleCreateCubes(Fxu_Matrix *, Fxu_Cube *, Fxu_Cube *, Fxu_Double *)"
                     );
      }
      if (pFVar1->nLits2 == iVar6) {
        if (pFVar1->nBase == iVar2) {
          p->ppTailCubes = &p->pOrderCubes;
          p->pOrderCubes = (Fxu_Cube *)0x0;
          p->ppTailVars = &p->pOrderVars;
          p->pOrderVars = (Fxu_Var *)0x0;
          Fxu_UpdateDoublePairs(p,pLink,pVar_00);
          pFVar3 = p->pOrderCubes;
          if ((Fxu_Cube *)0x1 < pFVar3) {
            do {
              Fxu_UpdateAddNewDoubles(p,pFVar3);
              pFVar3 = pFVar3->pOrder;
            } while (pFVar3 != (Fxu_Cube *)0x1);
          }
          Fxu_UpdateCleanOldSingles(p);
          Fxu_MatrixRingCubesUnmark(p);
          Fxu_MatrixRingVarsUnmark(p);
          Fxu_MatrixComputeSinglesOne(p,pVar);
          Fxu_MatrixComputeSinglesOne(p,pVar_00);
          if (pLink != (Fxu_Double *)0x0) {
            Fxu_MemRecycle(p,(char *)pLink,0x40);
          }
          p->nDivs2 = p->nDivs2 + 1;
          return;
        }
        __assert_fail("pPair->nBase == nBase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                      ,0x185,
                      "void Fxu_UpdateMatrixDoubleCreateCubes(Fxu_Matrix *, Fxu_Cube *, Fxu_Cube *, Fxu_Double *)"
                     );
      }
      __assert_fail("pPair->nLits2 == nLits2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                    ,0x184,
                    "void Fxu_UpdateMatrixDoubleCreateCubes(Fxu_Matrix *, Fxu_Cube *, Fxu_Cube *, Fxu_Double *)"
                   );
    }
    Fxu_MatrixAddLiteral(p,pCube,pFVar5->pVar);
    pFVar9 = (Fxu_Lit *)0x0;
LAB_00445299:
    iVar6 = iVar6 + 1;
    pFVar4 = (Fxu_ListLit *)&pFVar5->pHNext;
  } while( true );
}

Assistant:

void Fxu_UpdateDouble( Fxu_Matrix * p )
{
    Fxu_Double * pDiv;
	Fxu_Cube * pCube, * pCubeNew1, * pCubeNew2;
	Fxu_Var * pVarC, * pVarD;

    // remove the best divisor from the heap
    pDiv = Fxu_HeapDoubleGetMax( p->pHeapDouble );
	// remove the best divisor from the table
	Fxu_ListTableDelDivisor( p, pDiv );

    // create two new columns (vars)
    Fxu_UpdateCreateNewVars( p, &pVarC, &pVarD, 2 );
    // create two new rows (cubes)
    pCubeNew1 = Fxu_MatrixAddCube( p, pVarD, 0 );
    pCubeNew1->pFirst = pCubeNew1;
    pCubeNew2 = Fxu_MatrixAddCube( p, pVarD, 1 );
    pCubeNew2->pFirst = pCubeNew1;
    // set the first cube
    pVarD->pFirst = pCubeNew1;

    // add the literals to the new cubes
    Fxu_UpdateMatrixDoubleCreateCubes( p, pCubeNew1, pCubeNew2, pDiv );

    // start collecting the affected cubes and vars
    Fxu_MatrixRingCubesStart( p );
    Fxu_MatrixRingVarsStart( p );
	// replace each two cubes of the pair by one new cube
	// the new cube contains the base and the new literal
    Fxu_UpdateDoublePairs( p, pDiv, pVarD );
    // stop collecting the affected cubes and vars
    Fxu_MatrixRingCubesStop( p );
    Fxu_MatrixRingVarsStop( p );
    
    // create new doubles; we cannot add them in the same loop
	// because we first have to create *all* new cubes for each node
    Fxu_MatrixForEachCubeInRing( p, pCube )
   		Fxu_UpdateAddNewDoubles( p, pCube );
    // update the singles after removing some literals
    Fxu_UpdateCleanOldSingles( p );

    // undo the temporary rings with cubes and vars
    Fxu_MatrixRingCubesUnmark( p );
    Fxu_MatrixRingVarsUnmark( p );
    // we should undo the rings before creating new singles

    // create new singles
    Fxu_UpdateAddNewSingles( p, pVarC );
    Fxu_UpdateAddNewSingles( p, pVarD );

    // recycle the divisor
	MEM_FREE_FXU( p, Fxu_Double, 1, pDiv );
	p->nDivs2++;
}